

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O3

bool __thiscall QProgressStyleAnimation::isUpdateNeeded(QProgressStyleAnimation *this)

{
  int iVar1;
  
  iVar1 = QAbstractAnimation::currentTime();
  if (*(int *)(this + 0x10) < iVar1) {
    iVar1 = QAbstractAnimation::currentTime();
    iVar1 = (int)((double)iVar1 / (1000.0 / (double)*(int *)(this + 0x24)));
    if ((*(int *)(this + 0x28) == -1) || (*(int *)(this + 0x28) != iVar1)) {
      *(int *)(this + 0x28) = iVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool QProgressStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        int current = animationStep();
        if (_step == -1 || _step != current)
        {
            _step = current;
            return true;
        }
    }
    return false;
}